

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3AllocateMSI(Fts3Expr *pExpr,int iPhrase,void *pCtx)

{
  u32 *__s;
  
  __s = pExpr->aMI;
  if (__s == (u32 *)0x0) {
    __s = (u32 *)sqlite3_malloc64((long)*(int *)((long)pCtx + 0x30) * 0xc);
    pExpr->aMI = __s;
    if (__s == (u32 *)0x0) {
      return 7;
    }
  }
  memset(__s,0,(long)*(int *)((long)pCtx + 0x30) * 0xc);
  return 0;
}

Assistant:

static int fts3AllocateMSI(Fts3Expr *pExpr, int iPhrase, void *pCtx){
  Fts3Table *pTab = (Fts3Table*)pCtx;
  UNUSED_PARAMETER(iPhrase);
  if( pExpr->aMI==0 ){
    pExpr->aMI = (u32 *)sqlite3_malloc64(pTab->nColumn * 3 * sizeof(u32));
    if( pExpr->aMI==0 ) return SQLITE_NOMEM;
  }
  memset(pExpr->aMI, 0, pTab->nColumn * 3 * sizeof(u32));
  return SQLITE_OK;
}